

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

uint16_t prune_txk_type_separ
                   (AV1_COMP *cpi,MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,int blk_row,
                   int blk_col,BLOCK_SIZE plane_bsize,int *txk_map,int16_t allowed_tx_mask,
                   int prune_factor,TXB_CTX *txb_ctx,int reduced_tx_set_used,int64_t ref_best_rd,
                   int num_sel)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long in_RSI;
  long in_RDI;
  int *in_stack_00000018;
  int64_t factor;
  int in_stack_00000028;
  int i_1;
  uint16_t prune;
  int i;
  int last;
  int num_cand;
  int64_t rds [16];
  int i_h;
  int i_v;
  SCAN_ORDER *scan_order_1;
  int *idx_map_v;
  int end_v;
  int start_v;
  SCAN_ORDER *scan_order;
  int64_t sse;
  int64_t dist;
  int rate_cost;
  int tx_type;
  TxfmParam txfm_param;
  QUANT_PARAM quant_param;
  int sel_pattern_h [16];
  int sel_pattern_v [16];
  int idx_map [16];
  int skip_h [4];
  int skip_v [4];
  int idx_h [4];
  int idx_v [4];
  int64_t rds_h [4];
  int64_t rds_v [4];
  int idx;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  QUANT_PARAM *in_stack_fffffffffffffd38;
  undefined4 uVar5;
  ulong in_stack_fffffffffffffd40;
  undefined8 *puVar6;
  int in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd50;
  undefined2 in_stack_fffffffffffffd54;
  undefined2 uVar7;
  TX_TYPE in_stack_fffffffffffffd56;
  undefined1 uVar8;
  TX_SIZE in_stack_fffffffffffffd57;
  undefined1 uVar9;
  MACROBLOCK *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  undefined2 in_stack_fffffffffffffd68;
  undefined2 in_stack_fffffffffffffd6a;
  undefined4 in_stack_fffffffffffffd6c;
  int local_290;
  int local_28c;
  long local_288;
  int16_t *in_stack_fffffffffffffd80;
  qm_val_t *in_stack_fffffffffffffd88;
  TX_SIZE in_stack_fffffffffffffd97;
  int in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  undefined6 in_stack_fffffffffffffda0;
  TX_TYPE in_stack_fffffffffffffda6;
  TX_SIZE in_stack_fffffffffffffda7;
  int in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  MACROBLOCK *in_stack_fffffffffffffdb0;
  int64_t *in_stack_fffffffffffffdb8;
  undefined8 local_1e0;
  long local_1d8;
  int iVar10;
  int in_stack_fffffffffffffe38;
  undefined1 local_1b0 [40];
  int local_188 [16];
  int local_148 [16];
  int local_108 [16];
  int local_c8 [4];
  int local_b8 [4];
  int local_a8 [8];
  long local_88 [4];
  long local_68 [5];
  int local_3c;
  long local_38;
  long local_30;
  long local_18;
  uint16_t local_2;
  
  local_30 = in_RDI + 0x3bf80;
  local_38 = in_RSI + 0x1a0;
  local_a8[4] = 0;
  local_a8[5] = 1;
  local_a8[6] = 2;
  local_a8[7] = 3;
  local_a8[0] = 0;
  local_a8[1] = 1;
  local_a8[2] = 2;
  local_a8[3] = 3;
  local_18 = in_RSI;
  memset(local_b8,0,0x10);
  memset(local_c8,0,0x10);
  memcpy(local_108,&DAT_01a16d80,0x40);
  memcpy(local_148,&DAT_01a16dc0,0x40);
  memcpy(local_188,&DAT_01a16e00,0x40);
  av1_setup_xform((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                  in_stack_fffffffffffffd58,in_stack_fffffffffffffd57,in_stack_fffffffffffffd56,
                  (TxfmParam *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  av1_setup_quant((TX_SIZE)(in_stack_fffffffffffffd40 >> 0x38),(int)in_stack_fffffffffffffd40,
                  (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(int)in_stack_fffffffffffffd38,
                  (QUANT_PARAM *)0x139675e);
  iVar10 = 0;
  local_1d8 = 0;
  local_1e0 = 0;
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
    in_stack_fffffffffffffe38 =
         CONCAT31((int3)((uint)in_stack_fffffffffffffe38 >> 8),(char)local_108[local_3c]);
    av1_setup_qmatrix((CommonQuantParams *)
                      CONCAT17(in_stack_fffffffffffffd57,
                               CONCAT16(in_stack_fffffffffffffd56,
                                        CONCAT24(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50
                                                ))),
                      (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                      (int)(in_stack_fffffffffffffd40 >> 0x20),
                      (TX_SIZE)(in_stack_fffffffffffffd40 >> 0x18),
                      (TX_TYPE)(in_stack_fffffffffffffd40 >> 0x10),in_stack_fffffffffffffd38);
    av1_xform_quant((MACROBLOCK *)
                    CONCAT17(in_stack_fffffffffffffd57,
                             CONCAT16(in_stack_fffffffffffffd56,
                                      CONCAT24(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))
                            ),in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48,
                    (int)((ulong)local_1b0 >> 0x20),(int)local_1b0,
                    (BLOCK_SIZE)((ulong)&stack0xfffffffffffffe38 >> 0x38),
                    (TxfmParam *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                    (QUANT_PARAM *)
                    CONCAT44(in_stack_fffffffffffffd6c,
                             CONCAT22(in_stack_fffffffffffffd6a,in_stack_fffffffffffffd68)));
    get_scan('\0','\0');
    uVar5 = (undefined4)((ulong)&local_1d8 >> 0x20);
    puVar6 = &local_1e0;
    dist_block_tx_domain
              ((MACROBLOCK *)
               CONCAT17(in_stack_fffffffffffffda7,
                        CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)),
               in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,in_stack_fffffffffffffd97,
               in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
               (int64_t *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
    in_stack_fffffffffffffd38 = (QUANT_PARAM *)CONCAT44(uVar5,last);
    in_stack_fffffffffffffd40 = (ulong)puVar6 & 0xffffffff00000000;
    iVar10 = av1_cost_coeffs_txb_laplacian
                       (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
                        in_stack_fffffffffffffda8,in_stack_fffffffffffffda7,
                        in_stack_fffffffffffffda6,
                        (TXB_CTX *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                        iVar10,in_stack_fffffffffffffe38);
    local_88[local_3c] =
         ((long)iVar10 * (long)*(int *)(local_18 + 0x4218) + 0x100 >> 9) + local_1d8 * 0x80;
    if (rds[0] < local_88[local_3c] - (local_88[local_3c] >> 2)) {
      local_c8[local_3c] = 1;
    }
  }
  sort_rd(local_88,local_a8,4);
  for (local_3c = 1; local_3c < 4; local_3c = local_3c + 1) {
    if ((double)local_88[0] * 1.2 < (double)local_88[local_3c]) {
      local_c8[local_a8[local_3c]] = 1;
    }
  }
  if (local_c8[local_a8[0]] == 0) {
    local_68[0] = local_88[0];
    lVar4 = (long)local_a8[0];
    for (local_3c = 1; local_3c < 4; local_3c = local_3c + 1) {
      in_stack_fffffffffffffe38 =
           CONCAT31((int3)((uint)in_stack_fffffffffffffe38 >> 8),
                    (char)local_108[lVar4 + (local_a8[(long)local_3c + 4] << 2)]);
      av1_setup_qmatrix((CommonQuantParams *)
                        CONCAT17(in_stack_fffffffffffffd57,
                                 CONCAT16(in_stack_fffffffffffffd56,
                                          CONCAT24(in_stack_fffffffffffffd54,
                                                   in_stack_fffffffffffffd50))),
                        (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
                        ,(int)(in_stack_fffffffffffffd40 >> 0x20),
                        (TX_SIZE)(in_stack_fffffffffffffd40 >> 0x18),
                        (TX_TYPE)(in_stack_fffffffffffffd40 >> 0x10),in_stack_fffffffffffffd38);
      av1_xform_quant((MACROBLOCK *)
                      CONCAT17(in_stack_fffffffffffffd57,
                               CONCAT16(in_stack_fffffffffffffd56,
                                        CONCAT24(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50
                                                ))),in_stack_fffffffffffffd4c,
                      in_stack_fffffffffffffd48,(int)((ulong)local_1b0 >> 0x20),(int)local_1b0,
                      (BLOCK_SIZE)((ulong)&stack0xfffffffffffffe38 >> 0x38),
                      (TxfmParam *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                      (QUANT_PARAM *)
                      CONCAT44(in_stack_fffffffffffffd6c,
                               CONCAT22(in_stack_fffffffffffffd6a,in_stack_fffffffffffffd68)));
      get_scan('\0','\0');
      uVar5 = (undefined4)((ulong)&local_1d8 >> 0x20);
      puVar6 = &local_1e0;
      dist_block_tx_domain
                ((MACROBLOCK *)
                 CONCAT17(in_stack_fffffffffffffda7,
                          CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)),
                 in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,in_stack_fffffffffffffd97,
                 in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                 (int64_t *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffd38 = (QUANT_PARAM *)CONCAT44(uVar5,last);
      in_stack_fffffffffffffd40 = (ulong)puVar6 & 0xffffffff00000000;
      iVar10 = av1_cost_coeffs_txb_laplacian
                         (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
                          in_stack_fffffffffffffda8,in_stack_fffffffffffffda7,
                          in_stack_fffffffffffffda6,
                          (TXB_CTX *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                          iVar10,in_stack_fffffffffffffe38);
      local_68[local_3c] =
           ((long)iVar10 * (long)*(int *)(local_18 + 0x4218) + 0x100 >> 9) + local_1d8 * 0x80;
      if (rds[0] < local_68[local_3c] - (local_68[local_3c] >> 2)) {
        local_b8[local_3c] = 1;
      }
    }
    sort_rd(local_68,local_a8 + 4,4);
    for (local_3c = 1; local_3c < 4; local_3c = local_3c + 1) {
      if ((double)local_68[0] * 1.2 < (double)local_68[local_3c]) {
        local_b8[local_a8[(long)local_3c + 4]] = 1;
      }
    }
    local_28c = 0;
    local_290 = 0xf;
    for (iVar10 = 0; iVar10 < 0x10; iVar10 = iVar10 + 1) {
      iVar1 = local_148[iVar10];
      iVar2 = local_188[iVar10];
      iVar3 = local_108[local_a8[(long)iVar1 + 4] * 4 + local_a8[iVar2]];
      if (((((int)(short)factor & 1 << ((byte)iVar3 & 0x1f)) == 0) ||
          (local_c8[local_a8[iVar2]] != 0)) || (local_b8[local_a8[(long)iVar1 + 4]] != 0)) {
        in_stack_00000018[local_290] = iVar3;
        local_290 = local_290 + -1;
      }
      else {
        in_stack_00000018[local_28c] = iVar3;
        (&local_288)[local_28c] = local_68[iVar1] + local_88[iVar2];
        if ((&local_288)[local_28c] == 0) {
          (&local_288)[local_28c] = 1;
        }
        local_28c = local_28c + 1;
      }
    }
    sort_rd(&local_288,in_stack_00000018,local_28c);
    local_2 = (ushort)(1 << ((byte)*in_stack_00000018 & 0x1f)) ^ 0xffff;
    if ((int)rds[1] < local_28c) {
      uVar7 = (undefined2)(int)rds[1];
      uVar8 = (undefined1)((uint)(int)rds[1] >> 0x10);
      uVar9 = (undefined1)((uint)(int)rds[1] >> 0x18);
    }
    else {
      uVar7 = (undefined2)local_28c;
      uVar8 = (undefined1)((uint)local_28c >> 0x10);
      uVar9 = (undefined1)((uint)local_28c >> 0x18);
    }
    iVar10 = 1;
    while ((iVar10 < CONCAT13(uVar9,CONCAT12(uVar8,uVar7)) &&
           ((((&local_288)[iVar10] - local_288) * 0x708) / local_288 < (long)in_stack_00000028))) {
      local_2 = local_2 & ((ushort)(1 << ((byte)in_stack_00000018[iVar10] & 0x1f)) ^ 0xffff);
      iVar10 = iVar10 + 1;
    }
  }
  else {
    local_2 = 0xffff;
  }
  return local_2;
}

Assistant:

static uint16_t prune_txk_type_separ(
    const AV1_COMP *cpi, MACROBLOCK *x, int plane, int block, TX_SIZE tx_size,
    int blk_row, int blk_col, BLOCK_SIZE plane_bsize, int *txk_map,
    int16_t allowed_tx_mask, int prune_factor, const TXB_CTX *const txb_ctx,
    int reduced_tx_set_used, int64_t ref_best_rd, int num_sel) {
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;

  int idx;

  int64_t rds_v[4];
  int64_t rds_h[4];
  int idx_v[4] = { 0, 1, 2, 3 };
  int idx_h[4] = { 0, 1, 2, 3 };
  int skip_v[4] = { 0 };
  int skip_h[4] = { 0 };
  const int idx_map[16] = {
    DCT_DCT,      DCT_ADST,      DCT_FLIPADST,      V_DCT,
    ADST_DCT,     ADST_ADST,     ADST_FLIPADST,     V_ADST,
    FLIPADST_DCT, FLIPADST_ADST, FLIPADST_FLIPADST, V_FLIPADST,
    H_DCT,        H_ADST,        H_FLIPADST,        IDTX
  };

  const int sel_pattern_v[16] = {
    0, 0, 1, 1, 0, 2, 1, 2, 2, 0, 3, 1, 3, 2, 3, 3
  };
  const int sel_pattern_h[16] = {
    0, 1, 0, 1, 2, 0, 2, 1, 2, 3, 0, 3, 1, 3, 2, 3
  };

  QUANT_PARAM quant_param;
  TxfmParam txfm_param;
  av1_setup_xform(cm, x, tx_size, DCT_DCT, &txfm_param);
  av1_setup_quant(tx_size, 1, AV1_XFORM_QUANT_B, cpi->oxcf.q_cfg.quant_b_adapt,
                  &quant_param);
  int tx_type;
  // to ensure we can try ones even outside of ext_tx_set of current block
  // this function should only be called for size < 16
  assert(txsize_sqr_up_map[tx_size] <= TX_16X16);
  txfm_param.tx_set_type = EXT_TX_SET_ALL16;

  int rate_cost = 0;
  int64_t dist = 0, sse = 0;
  // evaluate horizontal with vertical DCT
  for (idx = 0; idx < 4; ++idx) {
    tx_type = idx_map[idx];
    txfm_param.tx_type = tx_type;

    av1_setup_qmatrix(&cm->quant_params, xd, plane, tx_size, tx_type,
                      &quant_param);

    av1_xform_quant(x, plane, block, blk_row, blk_col, plane_bsize, &txfm_param,
                    &quant_param);

    const SCAN_ORDER *const scan_order =
        get_scan(txfm_param.tx_size, txfm_param.tx_type);
    dist_block_tx_domain(x, plane, block, tx_size, quant_param.qmatrix,
                         scan_order->scan, &dist, &sse);

    rate_cost = av1_cost_coeffs_txb_laplacian(x, plane, block, tx_size, tx_type,
                                              txb_ctx, reduced_tx_set_used, 0);

    rds_h[idx] = RDCOST(x->rdmult, rate_cost, dist);

    if ((rds_h[idx] - (rds_h[idx] >> 2)) > ref_best_rd) {
      skip_h[idx] = 1;
    }
  }
  sort_rd(rds_h, idx_h, 4);
  for (idx = 1; idx < 4; idx++) {
    if (rds_h[idx] > rds_h[0] * 1.2) skip_h[idx_h[idx]] = 1;
  }

  if (skip_h[idx_h[0]]) return (uint16_t)0xFFFF;

  // evaluate vertical with the best horizontal chosen
  rds_v[0] = rds_h[0];
  int start_v = 1, end_v = 4;
  const int *idx_map_v = idx_map + idx_h[0];

  for (idx = start_v; idx < end_v; ++idx) {
    tx_type = idx_map_v[idx_v[idx] * 4];
    txfm_param.tx_type = tx_type;

    av1_setup_qmatrix(&cm->quant_params, xd, plane, tx_size, tx_type,
                      &quant_param);

    av1_xform_quant(x, plane, block, blk_row, blk_col, plane_bsize, &txfm_param,
                    &quant_param);

    const SCAN_ORDER *const scan_order =
        get_scan(txfm_param.tx_size, txfm_param.tx_type);
    dist_block_tx_domain(x, plane, block, tx_size, quant_param.qmatrix,
                         scan_order->scan, &dist, &sse);

    rate_cost = av1_cost_coeffs_txb_laplacian(x, plane, block, tx_size, tx_type,
                                              txb_ctx, reduced_tx_set_used, 0);

    rds_v[idx] = RDCOST(x->rdmult, rate_cost, dist);

    if ((rds_v[idx] - (rds_v[idx] >> 2)) > ref_best_rd) {
      skip_v[idx] = 1;
    }
  }
  sort_rd(rds_v, idx_v, 4);
  for (idx = 1; idx < 4; idx++) {
    if (rds_v[idx] > rds_v[0] * 1.2) skip_v[idx_v[idx]] = 1;
  }

  // combine rd_h and rd_v to prune tx candidates
  int i_v, i_h;
  int64_t rds[16];
  int num_cand = 0, last = TX_TYPES - 1;

  for (int i = 0; i < 16; i++) {
    i_v = sel_pattern_v[i];
    i_h = sel_pattern_h[i];
    tx_type = idx_map[idx_v[i_v] * 4 + idx_h[i_h]];
    if (!(allowed_tx_mask & (1 << tx_type)) || skip_h[idx_h[i_h]] ||
        skip_v[idx_v[i_v]]) {
      txk_map[last] = tx_type;
      last--;
    } else {
      txk_map[num_cand] = tx_type;
      rds[num_cand] = rds_v[i_v] + rds_h[i_h];
      if (rds[num_cand] == 0) rds[num_cand] = 1;
      num_cand++;
    }
  }
  sort_rd(rds, txk_map, num_cand);

  uint16_t prune = (uint16_t)(~(1 << txk_map[0]));
  num_sel = AOMMIN(num_sel, num_cand);

  for (int i = 1; i < num_sel; i++) {
    int64_t factor = 1800 * (rds[i] - rds[0]) / (rds[0]);
    if (factor < (int64_t)prune_factor)
      prune &= ~(1 << txk_map[i]);
    else
      break;
  }
  return prune;
}